

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O1

int xmlC14NVisibleNsStackAdd(xmlC14NVisibleNsStackPtr cur,xmlNsPtr ns,xmlNodePtr node)

{
  int iVar1;
  xmlNsPtr *ppxVar2;
  xmlNodePtr *ppxVar3;
  uint uVar4;
  int iVar5;
  
  if (cur == (xmlC14NVisibleNsStackPtr)0x0) {
    return 1;
  }
  if (cur->nsTab == (xmlNsPtr *)0x0) {
    if (cur->nodeTab != (xmlNodePtr *)0x0) {
      return 1;
    }
  }
  else if (cur->nodeTab == (xmlNodePtr *)0x0) {
    return 1;
  }
  iVar1 = cur->nsMax;
  if (iVar1 <= cur->nsCurEnd) {
    if (iVar1 < 1) {
      iVar5 = 0x10;
    }
    else {
      iVar5 = -1;
      if (iVar1 < 1000000000) {
        uVar4 = iVar1 + 1U >> 1;
        iVar5 = uVar4 + iVar1;
        if ((int)(1000000000 - uVar4) < iVar1) {
          iVar5 = 1000000000;
        }
      }
    }
    ppxVar2 = (xmlNsPtr *)(*xmlRealloc)(cur->nsTab,(long)iVar5 << 3);
    if (ppxVar2 == (xmlNsPtr *)0x0) {
      return -1;
    }
    cur->nsTab = ppxVar2;
    ppxVar3 = (xmlNodePtr *)(*xmlRealloc)(cur->nodeTab,(long)iVar5 << 3);
    if (ppxVar3 == (xmlNodePtr *)0x0) {
      return -1;
    }
    cur->nodeTab = ppxVar3;
    cur->nsMax = iVar5;
  }
  iVar1 = cur->nsCurEnd;
  cur->nsTab[iVar1] = ns;
  cur->nodeTab[iVar1] = node;
  cur->nsCurEnd = iVar1 + 1;
  return 0;
}

Assistant:

static int
xmlC14NVisibleNsStackAdd(xmlC14NVisibleNsStackPtr cur, xmlNsPtr ns, xmlNodePtr node) {
    if((cur == NULL) ||
       ((cur->nsTab == NULL) && (cur->nodeTab != NULL)) ||
       ((cur->nsTab != NULL) && (cur->nodeTab == NULL)))
	return (1);

    if (cur->nsMax <= cur->nsCurEnd) {
	xmlNsPtr *tmp1;
        xmlNodePtr *tmp2;
	int newSize;

        newSize = xmlGrowCapacity(cur->nsMax,
                                  sizeof(tmp1[0]) + sizeof(tmp2[0]),
                                  XML_NAMESPACES_DEFAULT, XML_MAX_ITEMS);

	tmp1 = xmlRealloc(cur->nsTab, newSize * sizeof(tmp1[0]));
	if (tmp1 == NULL)
	    return (-1);
	cur->nsTab = tmp1;

	tmp2 = xmlRealloc(cur->nodeTab, newSize * sizeof(tmp2[0]));
	if (tmp2 == NULL)
	    return (-1);
	cur->nodeTab = tmp2;

	cur->nsMax = newSize;
    }
    cur->nsTab[cur->nsCurEnd] = ns;
    cur->nodeTab[cur->nsCurEnd] = node;

    ++cur->nsCurEnd;

    return (0);
}